

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O2

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleNodes(OpenGEXImporter *this,DDLNode *node,aiScene *pScene)

{
  char *__rhs;
  bool bVar1;
  DllNodeList *__x;
  string *psVar2;
  aiScene *extraout_RDX;
  aiScene *extraout_RDX_00;
  aiScene *extraout_RDX_01;
  aiScene *extraout_RDX_02;
  aiScene *extraout_RDX_03;
  aiScene *extraout_RDX_04;
  aiScene *extraout_RDX_05;
  aiScene *extraout_RDX_06;
  aiScene *extraout_RDX_07;
  aiScene *extraout_RDX_08;
  pointer ppDVar3;
  DllNodeList childs;
  _Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_> local_48;
  
  if (node != (DDLNode *)0x0) {
    __x = ODDLParser::DDLNode::getChildNodeList(node);
    std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::vector
              ((vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_> *)&local_48,
               __x);
    for (ppDVar3 = local_48._M_impl.super__Vector_impl_data._M_start;
        ppDVar3 != local_48._M_impl.super__Vector_impl_data._M_finish; ppDVar3 = ppDVar3 + 1) {
      psVar2 = ODDLParser::DDLNode::getType_abi_cxx11_(*ppDVar3);
      __rhs = (psVar2->_M_dataplus)._M_p;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              Grammar::MetricType_abi_cxx11_,__rhs);
      if (bVar1) {
        handleMetricNode(this,*ppDVar3,extraout_RDX);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )Grammar::NameType_abi_cxx11_,__rhs);
        if (bVar1) {
          handleNameNode(this,*ppDVar3,extraout_RDX_00);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)Grammar::ObjectRefType_abi_cxx11_,__rhs);
          if (bVar1) {
            handleObjectRefNode(this,*ppDVar3,extraout_RDX_01);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)Grammar::MaterialRefType_abi_cxx11_,__rhs);
            if (bVar1) {
              handleMaterialRefNode(this,*ppDVar3,extraout_RDX_02);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)Grammar::MetricKeyType_abi_cxx11_,__rhs);
              if (!bVar1) {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)Grammar::GeometryNodeType_abi_cxx11_,__rhs);
                if (bVar1) {
                  handleGeometryNode(this,*ppDVar3,pScene);
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)Grammar::CameraNodeType_abi_cxx11_,__rhs);
                  if (bVar1) {
                    handleCameraNode(this,*ppDVar3,pScene);
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)Grammar::LightNodeType_abi_cxx11_,__rhs);
                    if (bVar1) {
                      handleLightNode(this,*ppDVar3,pScene);
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)Grammar::GeometryObjectType_abi_cxx11_,__rhs);
                      if (!bVar1) {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)Grammar::CameraObjectType_abi_cxx11_,__rhs);
                        if (!bVar1) {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)Grammar::LightObjectType_abi_cxx11_,__rhs);
                          if (bVar1) {
                            handleLightObject(this,*ppDVar3,pScene);
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)Grammar::TransformType_abi_cxx11_,__rhs);
                            if (bVar1) {
                              handleTransformNode(this,*ppDVar3,extraout_RDX_03);
                            }
                            else {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)Grammar::MeshType_abi_cxx11_,__rhs);
                              if (bVar1) {
                                handleMeshNode(this,*ppDVar3,pScene);
                              }
                              else {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)Grammar::VertexArrayType_abi_cxx11_,__rhs);
                                if (bVar1) {
                                  handleVertexArrayNode(this,*ppDVar3,extraout_RDX_04);
                                }
                                else {
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)Grammar::IndexArrayType_abi_cxx11_,__rhs);
                                  if (bVar1) {
                                    handleIndexArrayNode(this,*ppDVar3,extraout_RDX_05);
                                  }
                                  else {
                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)Grammar::MaterialType_abi_cxx11_,__rhs);
                                    if (bVar1) {
                                      handleMaterialNode(this,*ppDVar3,pScene);
                                    }
                                    else {
                                      bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)Grammar::ColorType_abi_cxx11_,__rhs);
                                      if (bVar1) {
                                        handleColorNode(this,*ppDVar3,extraout_RDX_06);
                                      }
                                      else {
                                        bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)Grammar::ParamType_abi_cxx11_,__rhs);
                                        if (bVar1) {
                                          handleParamNode(this,*ppDVar3,extraout_RDX_07);
                                        }
                                        else {
                                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)Grammar::TextureType_abi_cxx11_,__rhs);
                                          if (bVar1) {
                                            handleTextureNode(this,*ppDVar3,extraout_RDX_08);
                                          }
                                          else {
                                            std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)Grammar::AttenType_abi_cxx11_,__rhs);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                          goto LAB_00450087;
                        }
                      }
                      handleNodes(this,*ppDVar3,pScene);
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_00450087:
    }
    std::_Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::~_Vector_base
              (&local_48);
  }
  return;
}

Assistant:

void OpenGEXImporter::handleNodes( DDLNode *node, aiScene *pScene ) {
    if( nullptr == node ) {
        return;
    }

    DDLNode::DllNodeList childs = node->getChildNodeList();
    for( DDLNode::DllNodeList::iterator it = childs.begin(); it != childs.end(); ++it ) {
        Grammar::TokenType tokenType( Grammar::matchTokenType( ( *it )->getType().c_str() ) );
        switch( tokenType ) {
            case Grammar::MetricToken:
                handleMetricNode( *it, pScene );
                break;

            case Grammar::NameToken:
                handleNameNode( *it, pScene );
                break;

            case Grammar::ObjectRefToken:
                handleObjectRefNode( *it, pScene );
                break;

            case Grammar::MaterialRefToken:
                handleMaterialRefNode( *it, pScene );
                break;

            case Grammar::MetricKeyToken:
                break;

            case Grammar::GeometryNodeToken:
                handleGeometryNode( *it, pScene );
                break;

            case Grammar::CameraNodeToken:
                handleCameraNode( *it, pScene );
                break;

            case Grammar::LightNodeToken:
                handleLightNode( *it, pScene );
                break;

            case Grammar::GeometryObjectToken:
                handleGeometryObject( *it, pScene );
                break;

            case Grammar::CameraObjectToken:
                handleCameraObject( *it, pScene );
                break;

            case Grammar::LightObjectToken:
                handleLightObject( *it, pScene );
                break;

            case Grammar::TransformToken:
                handleTransformNode( *it, pScene );
                break;

            case Grammar::MeshToken:
                handleMeshNode( *it, pScene );
                break;

            case Grammar::VertexArrayToken:
                handleVertexArrayNode( *it, pScene );
                break;

            case Grammar::IndexArrayToken:
                handleIndexArrayNode( *it, pScene );
                break;

            case Grammar::MaterialToken:
                handleMaterialNode( *it, pScene );
                break;

            case Grammar::ColorToken:
                handleColorNode( *it, pScene );
                break;

            case Grammar::ParamToken:
                handleParamNode( *it, pScene );
                break;

            case Grammar::TextureToken:
                handleTextureNode( *it, pScene );
                break;

            default:
                break;
        }
    }
}